

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color_mode
          (ansicolor_sink<spdlog::details::console_mutex> *this,color_mode mode)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  color_mode in_stack_ffffffffffffffdc;
  ansicolor_sink<spdlog::details::console_mutex> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  set_color_mode_(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x180192);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color_mode(color_mode mode) {
    std::lock_guard<mutex_t> lock(mutex_);
    set_color_mode_(mode);
}